

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

SymbolInfo * __thiscall
ZXing::Pdf417::ReadSymbolInfo<ZXing::PointT<double>>
          (SymbolInfo *__return_storage_ptr__,Pdf417 *this,
          BitMatrixCursor<ZXing::PointT<double>_> topCur,PointT<double> rowSkip,int colWidth,
          int width,int height)

{
  CodeWord CVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_d8;
  int local_d4;
  ulong local_d0;
  ulong local_c8;
  _Type local_a8;
  PointT<double> local_98;
  undefined1 local_88 [16];
  PatternView local_78;
  BitMatrixCursor<ZXing::PointT<double>_> local_58;
  
  __return_storage_ptr__->width = colWidth;
  __return_storage_ptr__->height = width;
  __return_storage_ptr__->nRows = 0;
  __return_storage_ptr__->lastRow = -1;
  __return_storage_ptr__->rowHeight = 0.0;
  __return_storage_ptr__->colWidth = (int)this;
  dVar8 = topCur.p.x + rowSkip.x * 0.5;
  dVar9 = topCur.p.y + rowSkip.y * 0.5;
  local_d4 = 0;
  iVar6 = -1;
  local_88._8_4_ = SUB84(dVar9,0);
  local_88._0_8_ = dVar8;
  local_88._12_4_ = (int)((ulong)dVar9 >> 0x20);
  local_d8 = -1;
  local_c8 = 0;
  local_d0 = 0;
  uVar5 = 0;
  local_98 = rowSkip;
  do {
    if (uVar5 == 7) {
      __return_storage_ptr__->firstRow = iVar6;
      __return_storage_ptr__->nCols = local_d4;
      __return_storage_ptr__->ecLevel = local_d8;
LAB_00184669:
      __return_storage_ptr__->nRows = (int)local_d0 * 3 + (int)local_c8 + 1;
      return __return_storage_ptr__;
    }
    dVar7 = ABS((double)local_88._8_8_ - dVar9);
    if (ABS((double)local_88._8_8_ - dVar9) <= ABS((double)local_88._0_8_ - dVar8)) {
      dVar7 = ABS((double)local_88._0_8_ - dVar8);
    }
    if ((double)(width / 2) <= dVar7) {
LAB_0018463c:
      __return_storage_ptr__->firstRow = iVar6;
      __return_storage_ptr__->nCols = local_d4;
      __return_storage_ptr__->ecLevel = local_d8;
      if ((~uVar5 & 3) != 0) {
        return __return_storage_ptr__;
      }
      goto LAB_00184669;
    }
    local_58.img = topCur.img;
    local_58.d.x = topCur.d.x;
    local_58.d.y = topCur.d.y;
    local_58.p.x = dVar8;
    local_58.p.y = dVar9;
    local_a8 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                      readPatternFromBlack<std::array<unsigned_short,8ul>>
                                ((BitMatrixCursor<ZXing::PointT<double>> *)&local_58,1,(int)this + 2
                                );
    local_78._data = local_a8;
    local_78._size = 8;
    local_78._base = (Iterator)0x0;
    local_78._end = (Iterator)0x0;
    dVar7 = IsPattern<false,8,17>(&local_78,(FixedPattern<8,_17,_false> *)START_PATTERN,0,0.0,0.0);
    if ((dVar7 == 0.0) && (!NAN(dVar7))) goto LAB_0018463c;
    CVar1 = ReadCodeWord<ZXing::PointT<double>>(&local_58,-1);
    uVar4 = (ulong)CVar1 >> 0x20;
    if (uVar4 != 0xffffffff) {
      iVar2 = CVar1.cluster;
      uVar3 = CVar1.code >> 0x1f;
      if (iVar6 == -1) {
        iVar6 = (int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | (ulong)CVar1 & 0xffffffff) / 3)
                + (int)((long)((ulong)uVar3 << 0x20 | uVar4) / 0x1e) * 3;
      }
      if (iVar2 == 6) {
        local_d4 = (int)((long)((ulong)uVar3 << 0x20 | uVar4) % 0x1e) + 1;
      }
      else if (iVar2 == 3) {
        local_c8 = (long)((ulong)uVar3 << 0x20 | uVar4) % 3 & 0xffffffff;
        local_d8 = (int)(char)((char)((long)((ulong)uVar3 << 0x20 | uVar4) % 0x1e) / '\x03');
      }
      else {
        if (iVar2 != 0) goto LAB_00184631;
        local_d0 = (long)((ulong)uVar3 << 0x20 | uVar4) % 0x1e & 0xffffffff;
      }
      uVar5 = uVar5 | 1 << (((ushort)CVar1.cluster & 0xff) / 3 & 0x1f);
    }
LAB_00184631:
    dVar8 = dVar8 + local_98.x;
    dVar9 = dVar9 + local_98.y;
  } while( true );
}

Assistant:

SymbolInfo ReadSymbolInfo(BitMatrixCursor<POINT> topCur, POINT rowSkip, int colWidth, int width, int height)
{
	SymbolInfo res = {width, height};
	res.colWidth = colWidth;
	int clusterMask = 0;
	int rows0 = 0, rows1 = 0; // Suppress GNUC -Wmaybe-uninitialized

	topCur.p += .5f * rowSkip;

	for (auto startCur = topCur; clusterMask != 0b111 && maxAbsComponent(topCur.p - startCur.p) < height / 2; startCur.p += rowSkip) {
		auto cur = startCur;
		if (!IsPattern(cur.template readPatternFromBlack<Pattern417>(1, colWidth + 2), START_PATTERN))
			break;
		auto cw = ReadCodeWord(cur);
#ifdef PRINT_DEBUG
		printf("%3dx%3d:%2d: %4d.%d \n", int(cur.p.x), int(cur.p.y), Row(cw), cw.code, cw.cluster);
		fflush(stdout);
#endif
		if (!cw)
			continue;
		if (res.firstRow == -1)
			res.firstRow = Row(cw);
		switch (cw.cluster) {
		case 0: rows0 = cw.code % 30; break;
		case 3: rows1 = cw.code % 3, res.ecLevel = (cw.code % 30) / 3; break;
		case 6: res.nCols = (cw.code % 30) + 1; break;
		default: continue;
		}
		clusterMask |= (1 << cw.cluster / 3);
	}
	if ((clusterMask & 0b11) == 0b11)
		res.nRows = 3 * rows0 + rows1 + 1;
	return res;
}